

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int obsolete_op_p(gen_ctx_t gen_ctx,MIR_op_t op,size_t def_insn_num)

{
  int iVar1;
  size_t def_insn_num_local;
  gen_ctx_t gen_ctx_local;
  
  iVar1 = obsolete_var_op_p(gen_ctx,op,def_insn_num);
  if (iVar1 == 0) {
    if ((op._8_2_ & 0xff) == 0xb) {
      if ((op.u.mem.base != 0xffffffff) &&
         (iVar1 = obsolete_var_p(gen_ctx,op.u.mem.base,def_insn_num), iVar1 != 0)) {
        return 1;
      }
      if ((op.u.mem.index != 0xffffffff) &&
         (iVar1 = obsolete_var_p(gen_ctx,op.u.mem.index,def_insn_num), iVar1 != 0)) {
        return 1;
      }
      gen_ctx_local._4_4_ = (uint)(def_insn_num < gen_ctx->combine_ctx->last_mem_ref_insn_num);
    }
    else {
      gen_ctx_local._4_4_ = 0;
    }
  }
  else {
    gen_ctx_local._4_4_ = 1;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int obsolete_op_p (gen_ctx_t gen_ctx, MIR_op_t op, size_t def_insn_num) {
  if (obsolete_var_op_p (gen_ctx, op, def_insn_num)) return TRUE;
  if (op.mode != MIR_OP_VAR_MEM) return FALSE;
  if (op.u.var_mem.base != MIR_NON_VAR && obsolete_var_p (gen_ctx, op.u.var_mem.base, def_insn_num))
    return TRUE;
  if (op.u.var_mem.index != MIR_NON_VAR
      && obsolete_var_p (gen_ctx, op.u.var_mem.index, def_insn_num))
    return TRUE;
  return last_mem_ref_insn_num > def_insn_num;
}